

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O0

bool __thiscall slang::ast::ASTContext::requireIntegral(ASTContext *this,Expression *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  SourceLocation in_RSI;
  undefined8 in_RDI;
  Type *in_stack_00000008;
  Diagnostic *in_stack_00000010;
  Type *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe0;
  DiagCode code;
  undefined1 local_1;
  
  code = SUB84((ulong)in_RDI >> 0x20,0);
  bVar1 = Expression::bad((Expression *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    local_1 = false;
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x10fb9bd);
    bVar1 = Type::isIntegral(in_stack_ffffffffffffffc0);
    if (bVar1) {
      local_1 = true;
    }
    else {
      sourceRange.startLoc._4_4_ = 0x550007;
      sourceRange.startLoc._0_4_ = in_stack_ffffffffffffffe0;
      sourceRange.endLoc = in_RSI;
      addDiag(*(ASTContext **)((long)in_RSI + 0x28),code,sourceRange);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x10fba15)
      ;
      ast::operator<<(in_stack_00000010,in_stack_00000008);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ASTContext::requireIntegral(const Expression& expr) const {
    if (expr.bad())
        return false;

    if (!expr.type->isIntegral()) {
        addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return false;
    }

    return true;
}